

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O0

void Dam_ManUpdate(Dam_Man_t *p,int iDiv)

{
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  Gia_Man_t *p_02;
  Vec_Flt_t *p_03;
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iLit1_00;
  int LevR;
  int *piVar7;
  Gia_Obj_t *pObj;
  int local_60;
  int iNode;
  int iDivTemp;
  int fThisIsXor;
  int nRefs;
  int pPairsNew;
  int nPairsStop;
  int nPairsStart;
  int nPresent;
  int *pNods;
  int *pSet;
  int iLitNew;
  int i;
  int iLit1;
  int iLit0;
  Vec_Int_t *vDivs;
  int iDiv_local;
  Dam_Man_t *p_local;
  
  p_00 = p->pGia->vSuper;
  iVar2 = Hash_IntObjData0(p->vHash,iDiv);
  iVar3 = Hash_IntObjData1(p->vHash,iDiv);
  piVar7 = Dam_DivSet(p,iDiv);
  nPairsStop = 0;
  uVar4 = (uint)(iVar3 < iVar2);
  if (uVar4 == 0) {
    pSet._0_4_ = Gia_ManAppendAnd(p->pGia,iVar2,iVar3);
  }
  else {
    pSet._0_4_ = Gia_ManAppendXorReal(p->pGia,iVar2,iVar3);
  }
  p_01 = p->pGia;
  p_02 = p->pGia;
  iVar5 = Abc_Lit2Var((int)pSet);
  pObj = Gia_ManObj(p_02,iVar5);
  Gia_ObjSetGateLevel(p_01,pObj);
  if (1 < *piVar7) {
    iVar5 = Hash_IntManEntryNum(p->vHash);
    Vec_IntClear(p_00);
    for (pSet._4_4_ = 1; pSet._4_4_ <= *piVar7; pSet._4_4_ = pSet._4_4_ + 1) {
      iVar6 = Dam_ManUpdateNode(p,piVar7[pSet._4_4_],iVar2,iVar3,(int)pSet,p_00);
      nPairsStop = iVar6 + nPairsStop;
    }
    iVar2 = Hash_IntManEntryNum(p->vHash);
    iVar2 = iVar2 + 1;
    Vec_FltFillExtra(p->vCounts,iVar2,0.0);
    Vec_IntFillExtra(p->vDiv2Nod,iVar2,-1);
    for (pSet._4_4_ = iVar5 + 1; pSet._4_4_ < iVar2; pSet._4_4_ = pSet._4_4_ + 1) {
      iVar3 = Hash_IntObjData2(p->vHash,pSet._4_4_);
      if (1 < iVar3) {
        p_03 = p->vCounts;
        iVar6 = Hash_IntObjData0(p->vHash,pSet._4_4_);
        iLit1_00 = Hash_IntObjData1(p->vHash,pSet._4_4_);
        LevR = Vec_IntEntry(p->vDivLevR,pSet._4_4_);
        iVar6 = Dam_ManDivSlack(p,iVar6,iLit1_00,LevR);
        Vec_FltWriteEntry(p_03,pSet._4_4_,(float)iVar6 * 0.001 + (float)iVar3);
        Vec_QuePush(p->vQue,pSet._4_4_);
        pVVar1 = p->vDiv2Nod;
        iVar6 = Vec_IntSize(p->vNodStore);
        Vec_IntWriteEntry(pVVar1,pSet._4_4_,iVar6);
        Vec_IntPush(p->vNodStore,0);
        pVVar1 = p->vNodStore;
        iVar6 = Vec_IntSize(p->vNodStore);
        Vec_IntFillExtra(pVVar1,iVar6 + iVar3,-1);
      }
    }
    local_60 = -1;
    for (pSet._4_4_ = 0; iVar6 = Vec_IntSize(p_00), iVar3 = iVar5 + 1, pSet._4_4_ < iVar6;
        pSet._4_4_ = pSet._4_4_ + 1) {
      iVar3 = Vec_IntEntry(p_00,pSet._4_4_);
      if (iVar3 < 0) {
        local_60 = -iVar3;
      }
      else {
        iVar6 = Vec_IntEntry(p->vDiv2Nod,iVar3);
        if (iVar6 != -1) {
          piVar7 = Dam_DivSet(p,iVar3);
          iVar3 = *piVar7;
          *piVar7 = iVar3 + 1;
          piVar7[iVar3 + 1] = local_60;
        }
      }
    }
    do {
      pSet._4_4_ = iVar3;
      if (iVar2 <= pSet._4_4_) {
        Vec_FltWriteEntry(p->vCounts,iDiv,0.0);
        p->nGain = (uVar4 * 2 + 1) * (nPairsStop + -1) + p->nGain;
        p->nGainX = uVar4 * 3 * (nPairsStop + -1) + p->nGainX;
        p->nDivs = p->nDivs + 1;
        return;
      }
      iVar3 = Vec_IntEntry(p->vDiv2Nod,pSet._4_4_);
      if (0 < iVar3) {
        piVar7 = Dam_DivSet(p,pSet._4_4_);
        iVar3 = *piVar7;
        iVar5 = Hash_IntObjData2(p->vHash,pSet._4_4_);
        if (iVar3 != iVar5) {
          __assert_fail("Dam_DivSet(p, i)[0] == Hash_IntObjData2(p->vHash, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                        ,0x3e2,"void Dam_ManUpdate(Dam_Man_t *, int)");
        }
      }
      iVar3 = pSet._4_4_ + 1;
    } while( true );
  }
  __assert_fail("pNods[0] >= 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                ,0x3b9,"void Dam_ManUpdate(Dam_Man_t *, int)");
}

Assistant:

void Dam_ManUpdate( Dam_Man_t * p, int iDiv )
{
    Vec_Int_t * vDivs = p->pGia->vSuper;
    int iLit0 = Hash_IntObjData0(p->vHash, iDiv);
    int iLit1 = Hash_IntObjData1(p->vHash, iDiv);
    int i, iLitNew, * pSet, * pNods = Dam_DivSet( p, iDiv );
    int nPresent = 0, nPairsStart, nPairsStop, pPairsNew, nRefs;
    int fThisIsXor = (iLit0 > iLit1), iDivTemp, iNode;
//    Dam_PrintQue( p );
    if ( fThisIsXor )
        iLitNew = Gia_ManAppendXorReal( p->pGia, iLit0, iLit1 );
    else
        iLitNew = Gia_ManAppendAnd( p->pGia, iLit0, iLit1 );
    Gia_ObjSetGateLevel( p->pGia, Gia_ManObj(p->pGia, Abc_Lit2Var(iLitNew)) );
//    printf( "%d ", Gia_ObjLevel(p->pGia, Gia_ManObj(p->pGia, Abc_Lit2Var(iLitNew))) );
    // replace entries
    assert( pNods[0] >= 2 );
    nPairsStart = Hash_IntManEntryNum(p->vHash) + 1;
    Vec_IntClear( vDivs );
    for ( i = 1; i <= pNods[0]; i++ )
        nPresent += Dam_ManUpdateNode( p, pNods[i], iLit0, iLit1, iLitNew, vDivs );
    nPairsStop = Hash_IntManEntryNum(p->vHash) + 1;
    // extend arrayvs
    pPairsNew = 0;
    Vec_FltFillExtra( p->vCounts, nPairsStop, 0 );
    Vec_IntFillExtra( p->vDiv2Nod, nPairsStop, -1 );
    for ( i = nPairsStart; i < nPairsStop; i++ )
    {
        nRefs = Hash_IntObjData2(p->vHash, i);
        if ( nRefs < 2 )
            continue;
        Vec_FltWriteEntry( p->vCounts, i, nRefs + 0.001*Dam_ManDivSlack(p, Hash_IntObjData0(p->vHash, i), Hash_IntObjData1(p->vHash, i), Vec_IntEntry(p->vDivLevR, i)) );
        Vec_QuePush( p->vQue, i );
        // remember divisors
        Vec_IntWriteEntry( p->vDiv2Nod, i, Vec_IntSize(p->vNodStore) );
        Vec_IntPush( p->vNodStore, 0 );
        Vec_IntFillExtra( p->vNodStore, Vec_IntSize(p->vNodStore) + nRefs, -1 );
        pPairsNew++;
    }
//    printf( "Added %d new pairs\n", pPairsNew );
    // fill in the divisors
    iNode = -1;
    Vec_IntForEachEntry( vDivs, iDivTemp, i )
    {
        if ( iDivTemp < 0 )
        {
            iNode = -iDivTemp;
            continue;
        }
        if ( Vec_IntEntry(p->vDiv2Nod, iDivTemp) == -1 )
            continue;
        pSet = Dam_DivSet( p, iDivTemp );
        pSet[++pSet[0]] = iNode;
    }
    // make sure divisors are added correctly
    for ( i = nPairsStart; i < nPairsStop; i++ )
        if ( Vec_IntEntry(p->vDiv2Nod, i) > 0 )
            assert( Dam_DivSet(p, i)[0] == Hash_IntObjData2(p->vHash, i) );
    // update costs
    Vec_FltWriteEntry( p->vCounts, iDiv, 0 );
    p->nGain += (1 + 2 * fThisIsXor) * (nPresent - 1);
    p->nGainX += 3 * fThisIsXor * (nPresent - 1);
    p->nDivs++;
}